

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::StringParseTester::ByteSizeLong(StringParseTester *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  const_reference pbVar5;
  uint32_t *puVar6;
  string *psVar7;
  int local_70;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  StringParseTester *this_;
  StringParseTester *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_repeated_string_lowfield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  _i = google::protobuf::internal::FromIntSize(iVar2);
  _i = _i + sVar3;
  i_1 = 0;
  pRVar4 = _internal_repeated_string_lowfield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    pRVar4 = _internal_repeated_string_lowfield_abi_cxx11_(this);
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar4,i_1);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar3 + _i;
  }
  pRVar4 = _internal_repeated_string_midfield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar3 * 2 + _i;
  i_2 = 0;
  pRVar4 = _internal_repeated_string_midfield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    pRVar4 = _internal_repeated_string_midfield_abi_cxx11_(this);
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar4,i_2);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar3 + _i;
  }
  pRVar4 = _internal_repeated_string_hifield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar3 * 4 + _i;
  local_70 = 0;
  pRVar4 = _internal_repeated_string_hifield_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; local_70 < iVar2; local_70 = local_70 + 1) {
    pRVar4 = _internal_repeated_string_hifield_abi_cxx11_(this);
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar4,local_70);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar3 + _i;
  }
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar6;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar7 = _internal_optional_string_lowfield_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
      _i = sVar3 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      psVar7 = _internal_optional_string_midfield_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
      _i = sVar3 + 2 + _i;
    }
    if ((uVar1 & 4) != 0) {
      psVar7 = _internal_optional_string_hifield_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar7);
      _i = sVar3 + 4 + _i;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t StringParseTester::ByteSizeLong() const {
  const StringParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.StringParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string repeated_string_lowfield = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_lowfield().size());
      for (int i = 0, n = this_._internal_repeated_string_lowfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_lowfield().Get(i));
      }
    }
    // repeated string repeated_string_midfield = 1002;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_midfield().size());
      for (int i = 0, n = this_._internal_repeated_string_midfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_midfield().Get(i));
      }
    }
    // repeated string repeated_string_hifield = 1000002;
    {
      total_size +=
          4 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_hifield().size());
      for (int i = 0, n = this_._internal_repeated_string_hifield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_hifield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string optional_string_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_lowfield());
    }
    // string optional_string_midfield = 1001;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_midfield());
    }
    // string optional_string_hifield = 1000001;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 4 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}